

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               CylinderLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  Property *args;
  char *pcVar11;
  bool bVar12;
  char *pcVar13;
  string *psVar14;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_328 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_310;
  string local_300;
  string *local_2e0;
  long *local_2d8 [2];
  long local_2c8 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2b8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_278;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_270;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_268;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_260;
  _Base_ptr local_258;
  string local_250;
  string local_230;
  string local_210;
  undefined1 local_1f0 [16];
  code *local_1e0;
  code *pcStack_1d8;
  ios_base local_180 [264];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar12 = false;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2a8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar4) {
    p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_258 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar12 = true;
    if (p_Var10 != local_258) {
      local_260 = &light->length;
      local_268 = &light->radius;
      local_270 = &(light->super_BoundableLight).extent;
      local_278 = &(light->super_BoundableLight).props;
      local_2b8 = &(light->super_BoundableLight).purpose;
      local_2b0 = &(light->super_BoundableLight).visibility;
      local_2e0 = warn;
      do {
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        prop = (Property *)(p_Var10 + 2);
        local_1f0._0_8_ = &local_1e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"inputs:length","");
        psVar14 = (string *)local_1f0;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_328,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2a8,&local_210,prop,(string *)local_1f0,local_260);
        if ((code **)local_1f0._0_8_ != &local_1e0) {
          operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        iVar5 = 0;
        if ((local_328._0_8_ & 0xfffffffd) == 0) {
          iVar5 = 3;
LAB_00218744:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_328._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1f0,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcfb);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_2d8[0] = local_2c8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2d8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[14],std::__cxx11::string>
                      (&local_300,(fmt *)local_2d8,(string *)"inputs:length",
                       (char (*) [14])(local_328 + 8),psVar14);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1f0,local_300._M_dataplus._M_p,
                                local_300._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2d8[0] != local_2c8) {
              operator_delete(local_2d8[0],local_2c8[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2d8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_300.field_2._M_allocated_capacity = *psVar1;
                local_300.field_2._8_8_ = plVar7[3];
                local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
              }
              else {
                local_300.field_2._M_allocated_capacity = *psVar1;
                local_300._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_300._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_300);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if (local_2d8[0] != local_2c8) {
                operator_delete(local_2d8[0],local_2c8[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
            ::std::ios_base::~ios_base(local_180);
            iVar5 = 1;
            goto LAB_00218744;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._8_8_ != &aStack_310) {
          operator_delete((void *)local_328._8_8_,aStack_310._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          local_1f0._0_8_ = &local_1e0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"inputs:radius","");
          psVar14 = (string *)local_1f0;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_328,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2a8,&local_230,prop,(string *)local_1f0,local_268);
          if ((code **)local_1f0._0_8_ != &local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_328._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00218a45:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_328._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcfc);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_2d8[0] = local_2c8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2d8,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_300,(fmt *)local_2d8,(string *)"inputs:radius",
                         (char (*) [14])(local_328 + 8),psVar14);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1f0,local_300._M_dataplus._M_p,
                                  local_300._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if (local_2d8[0] != local_2c8) {
                operator_delete(local_2d8[0],local_2c8[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_2d8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_300.field_2._M_allocated_capacity = *psVar1;
                  local_300.field_2._8_8_ = plVar7[3];
                  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
                }
                else {
                  local_300.field_2._M_allocated_capacity = *psVar1;
                  local_300._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_300._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_300);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300._M_dataplus._M_p != &local_300.field_2) {
                  operator_delete(local_300._M_dataplus._M_p,
                                  local_300.field_2._M_allocated_capacity + 1);
                }
                if (local_2d8[0] != local_2c8) {
                  operator_delete(local_2d8[0],local_2c8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
              ::std::ios_base::~ios_base(local_180);
              iVar5 = 1;
              goto LAB_00218a45;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._8_8_ != &aStack_310) {
            operator_delete((void *)local_328._8_8_,aStack_310._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_00219917;
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          local_1f0._0_8_ = &local_1e0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"extent","");
          args = prop;
          anon_unknown_0::ParseExtentAttribute
                    ((ParseResult *)local_328,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2a8,&local_250,prop,(string *)local_1f0,local_270);
          if ((code **)local_1f0._0_8_ != &local_1e0) {
            operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_328._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_00218d3f:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_328._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1f0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcfd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_2d8[0] = local_2c8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2d8,"Parsing attribute `extent` failed. Error: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_300,(fmt *)local_2d8,(string *)(local_328 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1f0,local_300._M_dataplus._M_p,
                                  local_300._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_300._M_dataplus._M_p != &local_300.field_2) {
                operator_delete(local_300._M_dataplus._M_p,
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if (local_2d8[0] != local_2c8) {
                operator_delete(local_2d8[0],local_2c8[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_2d8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_300.field_2._M_allocated_capacity = *psVar1;
                  local_300.field_2._8_8_ = plVar7[3];
                  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
                }
                else {
                  local_300.field_2._M_allocated_capacity = *psVar1;
                  local_300._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_300._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_300);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_300._M_dataplus._M_p != &local_300.field_2) {
                  operator_delete(local_300._M_dataplus._M_p,
                                  local_300.field_2._M_allocated_capacity + 1);
                }
                if (local_2d8[0] != local_2c8) {
                  operator_delete(local_2d8[0],local_2c8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
              ::std::ios_base::~ios_base(local_180);
              iVar5 = 1;
              goto LAB_00218d3f;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._8_8_ != &aStack_310) {
            operator_delete((void *)local_328._8_8_,aStack_310._M_allocated_capacity + 1);
          }
          if (!bVar4) goto LAB_00219917;
          __k = p_Var10 + 1;
          iVar5 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar5 == 0) {
            local_1f0._0_8_ = &local_1e0;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"visibility","");
            cVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_2a8,(string *)local_1f0);
            if ((code **)local_1f0._0_8_ != &local_1e0) {
              operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
            }
            if ((_Rb_tree_header *)cVar8._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                Attribute::type_name_abi_cxx11_((string *)local_1f0,(Attribute *)prop);
                local_328._0_8_ = local_328 + 0x10;
                local_328._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_328._16_6_ = 0x6e656b6f74;
                if (((local_1f0._8_8_ == 5) &&
                    ((char)*(int *)(local_1f0._0_8_ + 4) == 'n' &&
                     *(int *)local_1f0._0_8_ == 0x656b6f74)) &&
                   (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), uVar3 < 2)) {
                  if ((code **)local_1f0._0_8_ != &local_1e0) {
                    operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                  }
                  if (uVar3 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xcff);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1f0,"\n",1);
                    psVar14 = local_2e0;
                    if (local_2e0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_328,&local_300,err);
                      ::std::__cxx11::string::operator=((string *)psVar14,(string *)local_328);
                      if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                        operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_300._M_dataplus._M_p != &local_300.field_2) {
                        operator_delete(local_300._M_dataplus._M_p,
                                        local_300.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                    ::std::ios_base::~ios_base(local_180);
                    AttrMetas::operator=(&local_2b0->_metas,(AttrMetas *)(p_Var10 + 7));
                    pcVar11 = "";
                    pcVar13 = "visibility";
LAB_002195bc:
                    local_1f0._0_8_ = &local_1e0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f0,pcVar13,pcVar11);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2a8,(string *)local_1f0);
                    if ((code **)local_1f0._0_8_ != &local_1e0) {
                      operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                    }
                    goto LAB_00219929;
                  }
                }
                else if ((code **)local_1f0._0_8_ != &local_1e0) {
                  operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                }
              }
              local_328._0_8_ = local_328 + 0x10;
              local_1f0._8_8_ = 0;
              local_1f0._0_8_ = VisibilityEnumHandler;
              pcStack_1d8 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_1e0 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"visibility","")
              ;
              bVar4 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_1e0 != (code *)0x0) {
                (*local_1e0)(&local_58,(string *)local_1f0,2);
                local_48 = local_1e0;
                pcStack_40 = pcStack_1d8;
              }
              bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                ((string *)local_328,bVar4,
                                 (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,(Attribute *)prop
                                 ,local_2b0,local_2e0,err);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
              }
              iVar5 = 1;
              if (bVar4) {
                AttrMetas::operator=(&local_2b0->_metas,(AttrMetas *)(p_Var10 + 7));
                pcVar11 = "";
                pcVar13 = "visibility";
LAB_002198cb:
                local_328._0_8_ = local_328 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_328,pcVar13,pcVar11);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
                if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                  operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                }
                iVar5 = 3;
              }
LAB_002198fd:
              if (local_1e0 != (code *)0x0) {
                (*local_1e0)((string *)local_1f0,(string *)local_1f0,3);
              }
              goto LAB_00219917;
            }
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar5 == 0) {
              local_1f0._0_8_ = &local_1e0;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"purpose","");
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2a8,(string *)local_1f0);
              if ((code **)local_1f0._0_8_ != &local_1e0) {
                operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
              }
              if ((_Rb_tree_header *)cVar8._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_1f0,(Attribute *)prop);
                  local_328._0_8_ = local_328 + 0x10;
                  local_328._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_328._16_6_ = 0x6e656b6f74;
                  if (((local_1f0._8_8_ == 5) &&
                      ((char)*(int *)(local_1f0._0_8_ + 4) == 'n' &&
                       *(int *)local_1f0._0_8_ == 0x656b6f74)) &&
                     (uVar3 = *(uint *)((long)&p_Var10[0x17]._M_parent + 4), uVar3 < 2)) {
                    if ((code **)local_1f0._0_8_ != &local_1e0) {
                      operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                    }
                    if (uVar3 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"():",3);
                      poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xd01);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1f0,"\n",1);
                      psVar14 = local_2e0;
                      if (local_2e0 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_328,&local_300,err);
                        ::std::__cxx11::string::operator=((string *)psVar14,(string *)local_328);
                        if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                          operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_300._M_dataplus._M_p != &local_300.field_2) {
                          operator_delete(local_300._M_dataplus._M_p,
                                          local_300.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                      ::std::ios_base::~ios_base(local_180);
                      AttrMetas::operator=(&local_2b8->_metas,(AttrMetas *)(p_Var10 + 7));
                      pcVar11 = "";
                      pcVar13 = "purpose";
                      goto LAB_002195bc;
                    }
                  }
                  else if ((code **)local_1f0._0_8_ != &local_1e0) {
                    operator_delete((void *)local_1f0._0_8_,(ulong)((long)local_1e0 + 1));
                  }
                }
                local_328._0_8_ = local_328 + 0x10;
                local_1f0._8_8_ = 0;
                local_1f0._0_8_ = PurposeEnumHandler;
                pcStack_1d8 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_1e0 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"purpose","");
                bVar4 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_1e0 != (code *)0x0) {
                  (*local_1e0)(&local_78,(string *)local_1f0,2);
                  local_68 = local_1e0;
                  pcStack_60 = pcStack_1d8;
                }
                bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_328,bVar4,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,(Attribute *)prop,
                                   local_2b8,local_2e0,err);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                  operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                }
                iVar5 = 1;
                if (bVar4) {
                  AttrMetas::operator=(&local_2b8->_metas,(AttrMetas *)(p_Var10 + 7));
                  pcVar11 = "";
                  pcVar13 = "purpose";
                  goto LAB_002198cb;
                }
                goto LAB_002198fd;
              }
            }
            else {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2a8,(key_type *)__k);
              if ((_Rb_tree_header *)cVar8._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
                pmVar9 = ::std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         ::operator[](local_278,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar9);
                (pmVar9->_attrib)._varying_authored = (bool)p_Var10[3].field_0x4;
                (pmVar9->_attrib)._variability = p_Var10[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar9->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar9->_attrib)._var,(any *)&p_Var10[4]._M_parent);
                (pmVar9->_attrib)._var._blocked = SUB41(p_Var10[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(pmVar9->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var10[5]._M_parent);
                (pmVar9->_attrib)._var._ts._dirty = SUB41(p_Var10[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar9->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var10[6]._M_parent);
                AttrMetas::operator=(&(pmVar9->_attrib)._metas,(AttrMetas *)(p_Var10 + 7));
                *(_Base_ptr *)&pmVar9->_listOpQual = p_Var10[0x17]._M_parent;
                (pmVar9->_rel).type = *(Type *)&p_Var10[0x17]._M_left;
                Path::operator=(&(pmVar9->_rel).targetPath,(Path *)&p_Var10[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar9->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var10[0x1e]._M_parent);
                (pmVar9->_rel).listOpQual = p_Var10[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar9->_rel)._metas,(AttrMetas *)&p_Var10[0x1f]._M_parent);
                (pmVar9->_rel)._varying_authored = *(bool *)&p_Var10[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar9->_prop_value_type_name);
                pmVar9->_has_custom = *(bool *)&p_Var10[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_2a8,(key_type *)__k);
              if ((_Rb_tree_header *)cVar8._M_node == &local_2a8._M_impl.super__Rb_tree_header) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1f0,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((string *)local_1f0,0xd03);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_328,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1f0,(char *)local_328._0_8_,local_328._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                psVar1 = (size_type *)(local_328 + 0x10);
                if ((size_type *)local_328._0_8_ != psVar1) {
                  operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                }
                psVar14 = local_2e0;
                if (local_2e0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar7 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_300,(ulong)(err->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar7 + 2);
                  if ((size_type *)*plVar7 == psVar2) {
                    local_328._16_8_ = *psVar2;
                    aStack_310._M_allocated_capacity = plVar7[3];
                    local_328._0_8_ = psVar1;
                  }
                  else {
                    local_328._16_8_ = *psVar2;
                    local_328._0_8_ = (size_type *)*plVar7;
                  }
                  local_328._8_8_ = plVar7[1];
                  *plVar7 = (long)psVar2;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar14,(string *)local_328);
                  if ((size_type *)local_328._0_8_ != psVar1) {
                    operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_300._M_dataplus._M_p != &local_300.field_2) {
                    operator_delete(local_300._M_dataplus._M_p,
                                    local_300.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
                ::std::ios_base::~ios_base(local_180);
              }
            }
          }
        }
        else {
LAB_00219917:
          if ((iVar5 != 3) && (iVar5 != 0)) {
            bVar12 = false;
            goto LAB_002199ce;
          }
        }
LAB_00219929:
        p_Var10 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while (p_Var10 != local_258);
      bVar12 = true;
    }
  }
LAB_002199ce:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2a8,(_Link_type)local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar12;
}

Assistant:

bool ReconstructPrim<CylinderLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    CylinderLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:length", CylinderLight, light->length)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", CylinderLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, CylinderLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, CylindrLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, CylinderLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}